

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O1

void __thiscall muduo::Logger::~Logger(Logger *this)

{
  char *pcVar1;
  
  Impl::finish(&this->impl_);
  pcVar1 = (this->impl_).stream_.buffer_.data_;
  (*(code *)g_output)(pcVar1,*(int *)&(this->impl_).stream_.buffer_.cur_ - (int)pcVar1);
  if ((this->impl_).level_ != FATAL) {
    (this->impl_).stream_.buffer_.cookie_ = detail::FixedBuffer<4000>::cookieEnd;
    return;
  }
  (*(code *)g_flush)();
  abort();
}

Assistant:

Logger::~Logger()
{
  impl_.finish();
  const LogStream::Buffer& buf(stream().buffer());
  g_output(buf.data(), buf.length());
  if (impl_.level_ == FATAL)
  {
    g_flush();
    abort();
  }
}